

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void mi_heap_collect_ex(mi_heap_t *heap,mi_collect_t collect)

{
  mi_threadid_t mVar1;
  _Bool _Var2;
  mi_threadid_t mVar3;
  uint in_ESI;
  mi_heap_t *in_RDI;
  byte bVar4;
  mi_heap_t *unaff_retaddr;
  mi_heap_t *in_stack_00000008;
  mi_heap_t *in_stack_00000010;
  _Bool force_main;
  _Bool is_main_thread;
  _Bool force;
  mi_segments_tld_t *in_stack_00000030;
  _Bool in_stack_0000003f;
  mi_heap_t *in_stack_00000040;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte bVar5;
  undefined1 uVar6;
  byte bVar7;
  
  if ((in_RDI != (mi_heap_t *)0x0) && (_Var2 = mi_heap_is_initialized(in_RDI), _Var2)) {
    bVar4 = in_ESI != 0;
    _mi_deferred_free((mi_heap_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                      (_Bool)in_stack_ffffffffffffffdf);
    _Var2 = _mi_is_main_thread();
    uVar6 = false;
    if (_Var2) {
      mVar1 = in_RDI->thread_id;
      mVar3 = _mi_thread_id();
      uVar6 = mVar1 == mVar3;
    }
    bVar5 = 0;
    bVar7 = uVar6;
    if ((in_ESI == 1) && (bVar5 = 0, (bool)uVar6 != false)) {
      _Var2 = mi_heap_is_backing(in_RDI);
      bVar5 = 0;
      if (_Var2) {
        bVar5 = in_RDI->no_reclaim ^ 0xff;
      }
    }
    bVar5 = bVar5 & 1;
    if (bVar5 != 0) {
      _mi_abandoned_reclaim_all(in_stack_00000010,(mi_segments_tld_t *)in_stack_00000008);
    }
    if (in_ESI == 2) {
      mi_heap_visit_pages(in_stack_00000008,(heap_page_visitor_fun *)unaff_retaddr,in_RDI,
                          (void *)CONCAT44(2,CONCAT13(bVar4,CONCAT12(bVar7,CONCAT11(bVar5,uVar6)))))
      ;
    }
    _mi_heap_delayed_free_all((mi_heap_t *)0xac4240);
    _mi_heap_collect_retired(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
    mi_heap_visit_pages(in_stack_00000008,(heap_page_visitor_fun *)unaff_retaddr,in_RDI,
                        (void *)CONCAT44(in_ESI,CONCAT13(bVar4,CONCAT12(bVar7,CONCAT11(bVar5,uVar6))
                                                        )));
    _mi_abandoned_collect(in_stack_00000040,in_stack_0000003f,in_stack_00000030);
    if ((((bVar4 & 1) != 0) && ((bVar7 & 1) != 0)) && (_Var2 = mi_heap_is_backing(in_RDI), _Var2)) {
      _mi_thread_data_collect();
    }
    _mi_arenas_collect(false);
    if (in_ESI < 2) {
      mi_stats_merge();
    }
  }
  return;
}

Assistant:

static void mi_heap_collect_ex(mi_heap_t* heap, mi_collect_t collect)
{
  if (heap==NULL || !mi_heap_is_initialized(heap)) return;

  const bool force = (collect >= MI_FORCE);
  _mi_deferred_free(heap, force);

  // python/cpython#112532: we may be called from a thread that is not the owner of the heap
  const bool is_main_thread = (_mi_is_main_thread() && heap->thread_id == _mi_thread_id());

  // note: never reclaim on collect but leave it to threads that need storage to reclaim
  const bool force_main =
    #ifdef NDEBUG
      collect == MI_FORCE
    #else
      collect >= MI_FORCE
    #endif
      && is_main_thread && mi_heap_is_backing(heap) && !heap->no_reclaim;

  if (force_main) {
    // the main thread is abandoned (end-of-program), try to reclaim all abandoned segments.
    // if all memory is freed by now, all segments should be freed.
    // note: this only collects in the current subprocess
    _mi_abandoned_reclaim_all(heap, &heap->tld->segments);
  }

  // if abandoning, mark all pages to no longer add to delayed_free
  if (collect == MI_ABANDON) {
    mi_heap_visit_pages(heap, &mi_heap_page_never_delayed_free, NULL, NULL);
  }

  // free all current thread delayed blocks.
  // (if abandoning, after this there are no more thread-delayed references into the pages.)
  _mi_heap_delayed_free_all(heap);

  // collect retired pages
  _mi_heap_collect_retired(heap, force);

  // collect all pages owned by this thread
  mi_heap_visit_pages(heap, &mi_heap_page_collect, &collect, NULL);
  mi_assert_internal( collect != MI_ABANDON || mi_atomic_load_ptr_acquire(mi_block_t,&heap->thread_delayed_free) == NULL );

  // collect abandoned segments (in particular, purge expired parts of segments in the abandoned segment list)
  // note: forced purge can be quite expensive if many threads are created/destroyed so we do not force on abandonment
  _mi_abandoned_collect(heap, collect == MI_FORCE /* force? */, &heap->tld->segments);

  // if forced, collect thread data cache on program-exit (or shared library unload)
  if (force && is_main_thread && mi_heap_is_backing(heap)) {
    _mi_thread_data_collect();  // collect thread data cache
  }

  // collect arenas (this is program wide so don't force purges on abandonment of threads)
  _mi_arenas_collect(collect == MI_FORCE /* force purge? */);

  // merge statistics
  if (collect <= MI_FORCE) {
    mi_stats_merge();
  }
}